

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

float deqp::gles3::Performance::vectorFloatMedian<long>(vector<long,_std::allocator<long>_> *v)

{
  ulong uVar1;
  vector<long,_std::allocator<long>_> temp;
  float local_24;
  _Vector_base<long,_std::allocator<long>_> local_20;
  
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_20,v);
  std::
  __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_20._M_impl.super__Vector_impl_data._M_start,
             local_20._M_impl.super__Vector_impl_data._M_finish);
  uVar1 = (ulong)((long)local_20._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_20._M_impl.super__Vector_impl_data._M_start >> 3) >> 1;
  if (((long)local_20._M_impl.super__Vector_impl_data._M_finish -
       (long)local_20._M_impl.super__Vector_impl_data._M_start & 8U) == 0) {
    local_24 = ((float)local_20._M_impl.super__Vector_impl_data._M_start[uVar1] +
               (float)local_20._M_impl.super__Vector_impl_data._M_start[uVar1 - 1]) * 0.5;
  }
  else {
    local_24 = (float)local_20._M_impl.super__Vector_impl_data._M_start[uVar1];
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_20);
  return local_24;
}

Assistant:

static float vectorFloatMedian (const vector<T>& v)
{
	DE_ASSERT(!v.empty());
	vector<T> temp = v;
	std::sort(temp.begin(), temp.end());
	return temp.size() % 2 == 0
		   ? 0.5f * ((float)temp[temp.size()/2-1] + (float)temp[temp.size()/2])
		   : (float)temp[temp.size()/2];
}